

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadGlobalHeader
          (BinaryReader *this,Type *out_type,bool *out_mutable)

{
  bool bVar1;
  Result RVar2;
  Enum EVar3;
  Type type_00;
  uint8_t mutable_;
  uint32_t type;
  bool local_2d;
  Enum local_2c;
  
  local_2d = false;
  local_2c = Any;
  RVar2 = ReadS32Leb128(this,(uint32_t *)&local_2c,"global type");
  type_00.enum_ = Void;
  if (RVar2.enum_ != Error) {
    type_00.enum_ = local_2c;
  }
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    bVar1 = IsConcreteType(this,type_00);
    if (bVar1) {
      RVar2 = ReadU8(this,&local_2d,"global mutability");
      if (RVar2.enum_ != Error) {
        if (local_2d < true) {
          out_type->enum_ = (Enum)type_00;
          *out_mutable = local_2d;
          EVar3 = Ok;
        }
        else {
          PrintError(this,"global mutability must be 0 or 1");
        }
      }
    }
    else {
      PrintError(this,"invalid global type: %#x",(ulong)(uint)type_00.enum_);
    }
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReader::ReadGlobalHeader(Type* out_type, bool* out_mutable) {
  Type global_type = Type::Void;
  uint8_t mutable_ = 0;
  CHECK_RESULT(ReadType(&global_type, "global type"));
  ERROR_UNLESS(IsConcreteType(global_type), "invalid global type: %#x",
               static_cast<int>(global_type));

  CHECK_RESULT(ReadU8(&mutable_, "global mutability"));
  ERROR_UNLESS(mutable_ <= 1, "global mutability must be 0 or 1");

  *out_type = global_type;
  *out_mutable = mutable_;
  return Result::Ok;
}